

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_printf(log_handle *log,LOG_LEVEL lvl,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list args;
  char *fmt_local;
  LOG_LEVEL lvl_local;
  log_handle *log_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (lvl <= log->level) {
    args[0].overflow_arg_area = local_e8;
    args[0]._0_8_ = &stack0x00000008;
    local_38._4_4_ = 0x30;
    local_38._0_4_ = 0x18;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    args[0].reg_save_area = fmt;
    log_vprintf(log,lvl,fmt,(__va_list_tag *)local_38);
  }
  return;
}

Assistant:

void log_printf(struct log_handle *log, enum LOG_LEVEL lvl,
		const char *fmt, ...)
{
	va_list args;

	if ((unsigned int)lvl > log->level)
		return;

	va_start(args, fmt);
	log_vprintf(log, lvl, fmt, args);
	va_end(args);
}